

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembly_generator_x86.cpp
# Opt level: O0

void __thiscall
randomx::AssemblyGeneratorX86::h_CFROUND(AssemblyGeneratorX86 *this,Instruction *instr,int i)

{
  uint32_t uVar1;
  uint uVar2;
  ostream *poVar3;
  void *this_00;
  Instruction *in_RSI;
  AssemblyGeneratorX86 *in_RDI;
  int rotate;
  
  poVar3 = std::operator<<((ostream *)&in_RDI->field_0x10,"\tmov rax, ");
  poVar3 = std::operator<<(poVar3,*(char **)(regR + (ulong)in_RSI->src * 8));
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  uVar1 = Instruction::getImm32((Instruction *)0x10f553);
  uVar2 = 0xd - (uVar1 & 0x3f) & 0x3f;
  if (uVar2 != 0) {
    poVar3 = std::operator<<((ostream *)&in_RDI->field_0x10,"\trol rax, ");
    this_00 = (void *)std::ostream::operator<<(poVar3,uVar2);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  }
  poVar3 = std::operator<<((ostream *)&in_RDI->field_0x10,"\tand eax, 24576");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&in_RDI->field_0x10,"\tor eax, 40896");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&in_RDI->field_0x10,"\tpush rax");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&in_RDI->field_0x10,"\tldmxcsr dword ptr [rsp]");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&in_RDI->field_0x10,"\tpop rax");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  tracenop(in_RDI,in_RSI);
  return;
}

Assistant:

void AssemblyGeneratorX86::h_CFROUND(Instruction& instr, int i) {
		asmCode << "\tmov rax, " << regR[instr.src] << std::endl;
		int rotate = (13 - (instr.getImm32() & 63)) & 63;
		if (rotate != 0)
			asmCode << "\trol rax, " << rotate << std::endl;
		asmCode << "\tand eax, 24576" << std::endl;
		asmCode << "\tor eax, 40896" << std::endl;
		asmCode << "\tpush rax" << std::endl;
		asmCode << "\tldmxcsr dword ptr [rsp]" << std::endl;
		asmCode << "\tpop rax" << std::endl;
		tracenop(instr);
	}